

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O1

BoxArray * __thiscall amrex::BoxArray::surroundingNodes(BoxArray *this,int dir)

{
  uint uVar1;
  
  uVar1 = 0;
  switch((this->m_bat).m_bat_type) {
  case null:
  case coarsenRatio:
    break;
  case indexType:
  case indexType_coarsenRatio:
    uVar1 = (this->m_bat).m_op.m_indexType.m_typ.itype;
    break;
  default:
    uVar1 = (this->m_bat).m_op.m_bndryReg.m_typ.itype;
  }
  BATransformer::set_index_type(&this->m_bat,(IndexType)(uVar1 | 1 << (dir & 0x1fU)));
  return this;
}

Assistant:

BoxArray&
BoxArray::surroundingNodes (int dir)
{
    IndexType typ = ixType();
    typ.setType(dir, IndexType::NODE);
    return this->convert(typ);
}